

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O0

bool kwssys::SystemTools::ParseURLProtocol
               (string *URL,string *protocol,string *dataglom,bool decode)

{
  bool bVar1;
  byte in_CL;
  string *in_RDX;
  string *in_RSI;
  RegularExpression urlRe;
  string *in_stack_fffffffffffffd18;
  RegularExpression *in_stack_fffffffffffffd20;
  RegularExpression *this;
  string local_2c8 [32];
  string local_2a8 [32];
  RegularExpression local_288;
  string *in_stack_ffffffffffffffa8;
  bool local_1;
  
  this = (RegularExpression *)(local_288.regmatch.startp + 6);
  RegularExpression::RegularExpression(in_stack_fffffffffffffd20,(char *)in_stack_fffffffffffffd18);
  bVar1 = RegularExpression::find(in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (bVar1) {
    RegularExpression::match_abi_cxx11_(this,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
    in_stack_fffffffffffffd20 = &local_288;
    std::__cxx11::string::operator=(in_RSI,(string *)in_stack_fffffffffffffd20);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffd20);
    RegularExpression::match_abi_cxx11_(this,(int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
    std::__cxx11::string::operator=(in_RDX,local_2a8);
    std::__cxx11::string::~string(local_2a8);
    if ((in_CL & 1) != 0) {
      DecodeURL(in_stack_ffffffffffffffa8);
      std::__cxx11::string::operator=(in_RDX,local_2c8);
      std::__cxx11::string::~string(local_2c8);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  local_288.regmatch.startp[4]._0_4_ = 1;
  RegularExpression::~RegularExpression(in_stack_fffffffffffffd20);
  return local_1;
}

Assistant:

bool SystemTools::ParseURLProtocol(const std::string& URL,
                                   std::string& protocol,
                                   std::string& dataglom, bool decode)
{
  // match 0 entire url
  // match 1 protocol
  // match 2 dataglom following protocol://
  kwsys::RegularExpression urlRe(VTK_URL_PROTOCOL_REGEX);

  if (!urlRe.find(URL))
    return false;

  protocol = urlRe.match(1);
  dataglom = urlRe.match(2);

  if (decode) {
    dataglom = DecodeURL(dataglom);
  }

  return true;
}